

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::ArenaTest_FuzzFuseFreeRace_Test::ArenaTest_FuzzFuseFreeRace_Test
          (ArenaTest_FuzzFuseFreeRace_Test *this)

{
  ArenaTest_FuzzFuseFreeRace_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ArenaTest_FuzzFuseFreeRace_Test_00a11240;
  return;
}

Assistant:

TEST(ArenaTest, FuzzFuseFreeRace) {
  Environment env;

  absl::Notification done;
  std::vector<std::thread> threads;
  for (int i = 0; i < 10; ++i) {
    threads.emplace_back([&]() {
      absl::BitGen gen;
      while (!done.HasBeenNotified()) {
        env.RandomNewFree(gen);
      }
    });
  }

  absl::BitGen gen;
  auto end = absl::Now() + absl::Seconds(2);
  while (absl::Now() < end) {
    env.RandomFuse(gen);
  }
  done.Notify();
  for (auto& t : threads) t.join();
}